

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

void lj_cconv_ct_init(CTState *cts,CType *d,CTSize sz,uint8_t *dp,TValue *o,MSize len)

{
  uint uVar1;
  CType *pCVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  MSize local_34;
  
  uVar7 = (ulong)len;
  __n = (size_t)sz;
  if (len == 1) {
    iVar3 = lj_cconv_multi_init(cts,d,o);
    if (iVar3 == 0) {
      lj_cconv_ct_tv(cts,d,dp,o,0);
      return;
    }
  }
  else if (len == 0) goto LAB_00145d13;
  uVar1 = d->info;
  uVar4 = uVar1 >> 0x1c;
  if (uVar4 == 1) {
    local_34 = 0;
    memset(dp,0,__n);
    cconv_substruct_init(cts,d,dp,o,len,&local_34);
    if (len <= local_34) {
      return;
    }
    cconv_err_initov(cts,d);
  }
  if (uVar4 == 3) {
    pCVar2 = cts->tab;
    uVar4 = pCVar2[uVar1 & 0xffff].size;
    if (uVar4 * len <= sz) {
      if (len == 0) {
        uVar5 = 0;
      }
      else {
        uVar6 = 0;
        do {
          lj_cconv_ct_tv(cts,pCVar2 + (uVar1 & 0xffff),dp + uVar6,o,0);
          uVar5 = (int)uVar6 + uVar4;
          uVar6 = (ulong)uVar5;
          o = o + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      uVar1 = uVar4;
      if (uVar5 == uVar4) {
        for (; uVar1 < sz; uVar1 = uVar1 + uVar4) {
          memcpy(dp + uVar1,dp,(ulong)uVar4);
        }
        return;
      }
      dp = dp + uVar5;
      __n = (size_t)(sz - uVar5);
LAB_00145d13:
      memset(dp,0,__n);
      return;
    }
  }
  cconv_err_initov(cts,d);
}

Assistant:

void lj_cconv_ct_init(CTState *cts, CType *d, CTSize sz,
		      uint8_t *dp, TValue *o, MSize len)
{
  if (len == 0)
    memset(dp, 0, sz);
  else if (len == 1 && !lj_cconv_multi_init(cts, d, o))
    lj_cconv_ct_tv(cts, d, dp, o, 0);
  else if (ctype_isarray(d->info))  /* Also handles valarray init with len>1. */
    cconv_array_init(cts, d, sz, dp, o, len);
  else if (ctype_isstruct(d->info))
    cconv_struct_init(cts, d, sz, dp, o, len);
  else
    cconv_err_initov(cts, d);
}